

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

void __thiscall
LowererMD::Simd128GenerateUpperBoundCheck
          (LowererMD *this,RegOpnd *indexOpnd,IndirOpnd *indirOpnd,ValueType arrType,Instr *instr)

{
  undefined2 arrValueType;
  code *pcVar1;
  bool bVar2;
  uint32 offset;
  int iVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  ArrayRegOpnd *baseOpnd;
  IndirOpnd *compareSrc1;
  LabelInstr *target;
  IndirOpnd *dst;
  IntConstOpnd *src;
  IndirOpnd *compareSrc2;
  Lowerer *this_01;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb48,"(!m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "!m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  baseOpnd = IR::RegOpnd::AsArrayRegOpnd(indirOpnd->m_baseOpnd);
  if (baseOpnd->eliminatedUpperBoundCheck != false) {
    return;
  }
  if (baseOpnd->headSegmentLengthSym == (StackSym *)0x0) {
    offset = Lowerer::GetArrayOffsetOfLength(arrType);
    compareSrc1 = IR::IndirOpnd::New(&baseOpnd->super_RegOpnd,offset,TyUint32,this->m_func,false);
  }
  else {
    compareSrc1 = (IndirOpnd *)
                  IR::RegOpnd::New(baseOpnd->headSegmentLengthSym,TyUint32,this->m_func);
  }
  target = Lowerer::InsertLabel(false,instr);
  arrValueType = (baseOpnd->super_RegOpnd).super_Opnd.m_valueType;
  iVar3 = Lowerer::SimdGetElementCountFromBytes((ValueType)arrValueType,instr->dataWidth);
  if (indexOpnd == (RegOpnd *)0x0) {
    this_01 = this->m_lowerer;
    compareSrc2 = (IndirOpnd *)
                  IR::IntConstOpnd::New
                            ((long)(iVar3 + indirOpnd->m_offset),TyInt32,this->m_func,true);
  }
  else {
    dst = (IndirOpnd *)IR::RegOpnd::New((indexOpnd->super_Opnd).m_type,this->m_func);
    src = IR::IntConstOpnd::New((long)iVar3,TyInt8,this->m_func,true);
    Lowerer::InsertMove((Opnd *)dst,&src->super_Opnd,&target->super_Instr,true);
    Lowerer::InsertAdd(false,(Opnd *)dst,(Opnd *)dst,&indexOpnd->super_Opnd,&target->super_Instr);
    this_01 = this->m_lowerer;
    compareSrc2 = compareSrc1;
    compareSrc1 = dst;
  }
  Lowerer::InsertCompareBranch
            (this_01,&compareSrc1->super_Opnd,&compareSrc2->super_Opnd,BrLe_A,true,target,
             &target->super_Instr,false);
  Lowerer::GenerateRuntimeError
            (this->m_lowerer,&target->super_Instr,-0x7ff5ebf6,HelperOp_RuntimeRangeError);
  return;
}

Assistant:

void
LowererMD::Simd128GenerateUpperBoundCheck(IR::RegOpnd *indexOpnd, IR::IndirOpnd *indirOpnd, ValueType arrType, IR::Instr *instr)
{
    Assert(!m_func->GetJITFunctionBody()->IsAsmJsMode());

    IR::ArrayRegOpnd *arrayRegOpnd = indirOpnd->GetBaseOpnd()->AsArrayRegOpnd();
    IR::Opnd* headSegmentLengthOpnd;

    if (arrayRegOpnd->EliminatedUpperBoundCheck())
    {
        // already eliminated or extracted by globOpt (OptArraySrc). Nothing to do.
        return;
    }

    if (arrayRegOpnd->HeadSegmentLengthSym())
    {
        headSegmentLengthOpnd = IR::RegOpnd::New(arrayRegOpnd->HeadSegmentLengthSym(), TyUint32, m_func);
    }
    else
    {
        // (headSegmentLength = [base + offset(length)])
        int lengthOffset;
        lengthOffset = m_lowerer->GetArrayOffsetOfLength(arrType);
        headSegmentLengthOpnd = IR::IndirOpnd::New(arrayRegOpnd, lengthOffset, TyUint32, m_func);
    }

    IR::LabelInstr * skipLabel = Lowerer::InsertLabel(false, instr);
    int32 elemCount = Lowerer::SimdGetElementCountFromBytes(arrayRegOpnd->GetValueType(), instr->dataWidth);
    if (indexOpnd)
    {
        //  MOV tmp, elemCount
        //  ADD tmp, index
        //  CMP tmp, Length  -- upper bound check
        //  JBE  $storeLabel
        //  Throw RuntimeError
        //  skipLabel:
        IR::RegOpnd *tmp = IR::RegOpnd::New(indexOpnd->GetType(), m_func);
        IR::IntConstOpnd *elemCountOpnd = IR::IntConstOpnd::New(elemCount, TyInt8, m_func, true);
        m_lowerer->InsertMove(tmp, elemCountOpnd, skipLabel);
        Lowerer::InsertAdd(false, tmp, tmp, indexOpnd, skipLabel);
        m_lowerer->InsertCompareBranch(tmp, headSegmentLengthOpnd, Js::OpCode::BrLe_A, true, skipLabel, skipLabel);
    }
    else
    {
        // CMP Length, (offset + elemCount)
        // JA $storeLabel
        int32 offset = indirOpnd->GetOffset();
        int32 index = offset + elemCount;
        m_lowerer->InsertCompareBranch(headSegmentLengthOpnd, IR::IntConstOpnd::New(index, TyInt32, m_func, true), Js::OpCode::BrLe_A, true, skipLabel, skipLabel);
    }
    m_lowerer->GenerateRuntimeError(skipLabel, JSERR_ArgumentOutOfRange, IR::HelperOp_RuntimeRangeError);
    return;
}